

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall
cmComputeTargetDepends::CheckComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  pointer pcVar1;
  int *piVar2;
  int iVar3;
  TargetType TVar4;
  ulong uVar5;
  const_iterator __begin2;
  int *piVar6;
  ulong uVar7;
  
  uVar5 = ((long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar7 = 0;
  iVar3 = (int)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar3 < 1) {
    uVar5 = uVar7;
  }
  do {
    if (uVar7 == uVar5) {
LAB_002dca2c:
      return (long)iVar3 <= (long)uVar7;
    }
    pcVar1 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = *(int **)&pcVar1[uVar7].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    piVar2 = *(pointer *)
              ((long)&pcVar1[uVar7].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    if (4 < (ulong)((long)piVar2 - (long)piVar6)) {
      if (this->NoCycles != false) {
LAB_002dca1c:
        ComplainAboutBadComponent(this,ccg,(int)uVar7,false);
        goto LAB_002dca2c;
      }
      while (piVar6 != piVar2) {
        TVar4 = cmGeneratorTarget::GetType
                          ((this->Targets).
                           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar6]);
        piVar6 = piVar6 + 1;
        if (TVar4 != STATIC_LIBRARY) goto LAB_002dca1c;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::CheckComponents(
  cmComputeComponentGraph const& ccg)
{
  // All non-trivial components should consist only of static
  // libraries.
  std::vector<NodeList> const& components = ccg.GetComponents();
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // Immediately complain if no cycles are allowed at all.
    if (this->NoCycles) {
      this->ComplainAboutBadComponent(ccg, c);
      return false;
    }

    // Make sure the component is all STATIC_LIBRARY targets.
    for (int ni : nl) {
      if (this->Targets[ni]->GetType() != cmStateEnums::STATIC_LIBRARY) {
        this->ComplainAboutBadComponent(ccg, c);
        return false;
      }
    }
  }
  return true;
}